

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O0

void __thiscall
Diligent::ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::DiscardStaleResources
          (ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this,
          Uint64 SubmittedCmdBuffNumber,Uint64 FenceValue)

{
  bool bVar1;
  reference pvVar2;
  value_type *FirstStaleObj;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> ReleaseQueueLock;
  lock_guard<std::mutex> StaleObjectsLock;
  Uint64 FenceValue_local;
  Uint64 SubmittedCmdBuffNumber_local;
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this_local;
  
  StaleObjectsLock._M_device = (mutex_type *)FenceValue;
  std::lock_guard<std::mutex>::lock_guard(&ReleaseQueueLock,&this->m_StaleObjectsMutex);
  std::lock_guard<std::mutex>::lock_guard(&local_30,&this->m_ReleaseQueueMutex);
  while ((bVar1 = std::
                  deque<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
                  ::empty(&this->m_StaleResources), ((bVar1 ^ 0xffU) & 1) != 0 &&
         (pvVar2 = std::
                   deque<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
                   ::front(&this->m_StaleResources), pvVar2->first <= SubmittedCmdBuffNumber))) {
    std::
    deque<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::STDAllocator<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::IMemoryAllocator>>
    ::emplace_back<unsigned_long&,Diligent::DynamicStaleResourceWrapper>
              ((deque<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::STDAllocator<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::IMemoryAllocator>>
                *)&this->m_ReleaseQueue,(unsigned_long *)&StaleObjectsLock,&pvVar2->second);
    std::
    deque<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
    ::pop_front(&this->m_StaleResources);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  std::lock_guard<std::mutex>::~lock_guard(&ReleaseQueueLock);
  return;
}

Assistant:

void DiscardStaleResources(Uint64 SubmittedCmdBuffNumber, Uint64 FenceValue)
    {
        // Only discard these stale objects that were released before CmdBuffNumber
        // was executed
        std::lock_guard<std::mutex> StaleObjectsLock(m_StaleObjectsMutex);
        std::lock_guard<std::mutex> ReleaseQueueLock(m_ReleaseQueueMutex);
        while (!m_StaleResources.empty())
        {
            auto& FirstStaleObj = m_StaleResources.front();
            if (FirstStaleObj.first <= SubmittedCmdBuffNumber)
            {
                m_ReleaseQueue.emplace_back(FenceValue, std::move(FirstStaleObj.second));
                m_StaleResources.pop_front();
            }
            else
                break;
        }
    }